

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

int rank_c(double *A,int M,int N)

{
  int iVar1;
  double *U;
  double *V;
  double *q;
  ulong uVar2;
  long lVar3;
  double macheps;
  double dVar4;
  
  lVar3 = (long)N;
  U = (double *)malloc(M * lVar3 * 8);
  V = (double *)malloc(lVar3 * lVar3 * 8);
  q = (double *)malloc(lVar3 * 8);
  dVar4 = 1.0;
  do {
    dVar4 = dVar4 * 0.5;
  } while (1.0 < dVar4 + 1.0);
  iVar1 = svd(A,M,N,U,V,q);
  if (iVar1 == 0) {
    if (M <= N) {
      M = N;
    }
    if (N < 1) {
      iVar1 = 0;
    }
    else {
      uVar2 = 0;
      iVar1 = 0;
      do {
        iVar1 = iVar1 + (uint)((double)M * *q * (dVar4 + dVar4) < q[uVar2]);
        uVar2 = uVar2 + 1;
      } while ((uint)N != uVar2);
    }
    free(U);
    free(V);
    free(q);
  }
  else {
    printf("Failed to Compute SVD");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int rank_c(double *A, int M,int N) {
	int i,rnk,ret;
	double eps,tol,szmax,qmax;
	double *U,*V,*q;

	U = (double*) malloc(sizeof(double) * M*N);
	V = (double*) malloc(sizeof(double) * N*N);
	q = (double*) malloc(sizeof(double) * N);

	eps = macheps();
	rnk = 0;
	if (M < N) {
		//mtranspose(A,M,N,U);
		szmax = (double) N;
	} else {
		szmax = (double) M;
	}
	ret = svd(A,M,N,U,V,q);
	qmax = q[0];
	if ( ret != 0) {
		printf("Failed to Compute SVD");
		return -1;
	}

	tol = qmax*szmax *eps;

	for(i = 0; i < N;++i) {
		if (q[i] > tol) {
			rnk++;
		}
	}



	free(U);
	free(V);
	free(q);

	return rnk;
}